

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

bool parse_json_stats(string *foz_path,Document *doc)

{
  uint uVar1;
  pointer puVar2;
  int iVar3;
  DatabaseInterface *pDVar4;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar5;
  unsigned_long *hash;
  pointer puVar6;
  long lVar7;
  bool bVar8;
  size_t json_size;
  size_t num_hashes;
  Value v;
  vector<char,_std::allocator<char>_> json_buffer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  Document tmp_doc;
  
  pDVar4 = Fossilize::create_stream_archive_database((foz_path->_M_dataplus)._M_p,ReadOnly);
  if (pDVar4 == (DatabaseInterface *)0x0) {
    bVar8 = false;
  }
  else {
    iVar3 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4);
    if ((char)iVar3 == '\0') {
      bVar8 = false;
    }
    else {
      (doc->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.n = (Number)0x0;
      (doc->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.s.str = (Ch *)0x0;
      (doc->
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ).data_.f.flags = 4;
      json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      lVar7 = 0;
      while( true ) {
        bVar8 = lVar7 == 0xc;
        if (bVar8) break;
        num_hashes = 0;
        uVar1 = *(uint *)((long)parse_json_stats(std::__cxx11::string_const&,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>&)
                                ::stat_tags + lVar7);
        iVar3 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,(ulong)uVar1,&num_hashes,0);
        if ((char)iVar3 == '\0') break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&hashes,num_hashes,(allocator_type *)&tmp_doc);
        iVar3 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,(ulong)uVar1,&num_hashes);
        puVar2 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar6 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((char)iVar3 == '\0') {
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          break;
        }
        for (; puVar6 != puVar2; puVar6 = puVar6 + 1) {
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GenericDocument(&tmp_doc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                            (CrtAllocator *)0x0);
          json_size = 0;
          iVar3 = (*pDVar4->_vptr_DatabaseInterface[3])(pDVar4,(ulong)uVar1,*puVar6,&json_size,0,0);
          if ((char)iVar3 != '\0') {
            std::vector<char,_std::allocator<char>_>::resize(&json_buffer,json_size);
            iVar3 = (*pDVar4->_vptr_DatabaseInterface[3])(pDVar4,(ulong)uVar1,*puVar6);
            if ((char)iVar3 != '\0') {
              v.data_.n = (Number)((ulong)v.data_.n & 0xffffffffffffff00);
              std::vector<char,_std::allocator<char>_>::emplace_back<char>(&json_buffer,(char *)&v);
              rapidjson::GenericStringRef<char>::GenericStringRef
                        ((GenericStringRef<char> *)&v,
                         json_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
              rapidjson::
              GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              ::Parse<0u,rapidjson::UTF8<char>>
                        ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                          *)&tmp_doc,(Ch *)v.data_.n);
              if (tmp_doc.parseResult_.code_ == kParseErrorNone) {
                v.data_.n = (Number)0x0;
                v.data_.s.str = (Ch *)0x0;
                pMVar5 = rapidjson::
                         GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                         ::GetAllocator(doc);
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::CopyFrom<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)&v,&tmp_doc.
                                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ,pMVar5,false);
                pMVar5 = rapidjson::
                         GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                         ::GetAllocator(doc);
                rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::PushBack(&doc->
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ,&v,pMVar5);
              }
            }
          }
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::~GenericDocument(&tmp_doc);
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        lVar7 = lVar7 + 4;
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&json_buffer.super__Vector_base<char,_std::allocator<char>_>);
    }
    (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
  }
  return bVar8;
}

Assistant:

static bool parse_json_stats(const std::string &foz_path, rapidjson::Document &doc)
{
	auto db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(foz_path.c_str(), DatabaseMode::ReadOnly));
	if (!db)
		return false;
	if (!db->prepare())
		return false;

	static const ResourceTag stat_tags[] = {
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
		RESOURCE_RAYTRACING_PIPELINE,
	};

	doc.SetArray();

	std::vector<char> json_buffer;

	for (auto &tag : stat_tags)
	{
		size_t num_hashes = 0;
		if (!db->get_hash_list_for_resource_tag(tag, &num_hashes, nullptr))
			return false;
		std::vector<Hash> hashes(num_hashes);
		if (!db->get_hash_list_for_resource_tag(tag, &num_hashes, hashes.data()))
			return false;

		for (auto &hash : hashes)
		{
			rapidjson::Document tmp_doc;
			size_t json_size = 0;
			if (!db->read_entry(tag, hash, &json_size, nullptr, 0))
				continue;
			json_buffer.resize(json_size);
			if (!db->read_entry(tag, hash, &json_size, json_buffer.data(), 0))
				continue;
			json_buffer.push_back('\0');

			tmp_doc.Parse(rapidjson::StringRef(json_buffer.data()));
			if (tmp_doc.HasParseError())
				continue;

			rapidjson::Value v;
			v.CopyFrom(tmp_doc, doc.GetAllocator());
			doc.PushBack(v, doc.GetAllocator());
		}
	}

	return true;
}